

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MT.h
# Opt level: O3

int GetLatestMTMessageMT(MT *pMT,int addr,int mid,uchar *databuf,int databuflen,int *pNbdatabytes)

{
  uchar *__dest;
  int iVar1;
  ulong uVar2;
  ssize_t sVar3;
  long lVar4;
  ulong __n;
  long lVar5;
  char *__s;
  uint uVar6;
  bool bVar7;
  int len;
  uchar *ptr;
  CHRONO chrono;
  uchar recvbuf [4096];
  uchar savebuf [2048];
  int local_18b4;
  uchar *local_18b0;
  int local_18a4;
  timespec local_18a0;
  timespec local_1890;
  undefined8 local_1880;
  undefined8 uStack_1878;
  long local_1870;
  long lStack_1868;
  timespec local_1860;
  int local_1850;
  uint *local_1848;
  uchar *local_1840;
  uchar local_1838 [2047];
  undefined1 auStack_1039 [2049];
  undefined1 local_838 [2056];
  
  local_18b0 = (uchar *)0x0;
  local_18b4 = 0;
  iVar1 = clock_getres(4,&local_1860);
  if ((iVar1 == 0) && (iVar1 = clock_gettime(4,&local_1890), iVar1 == 0)) {
    local_1850 = 0;
    local_1880 = 0;
    uStack_1878 = 0;
    local_1870 = 0;
    lStack_1868 = 0;
  }
  memset(local_1838,0,0x1000);
  memset(local_838,0,0x800);
  iVar1 = (pMT->RS232Port).DevType;
  if (iVar1 - 1U < 4) {
    uVar2 = recv((pMT->RS232Port).s,local_1838,0x7ff,0);
LAB_001b8a73:
    if (0 < (int)(uint)uVar2) {
      local_18a4 = databuflen;
      local_1840 = databuf;
      if ((uint)uVar2 < 0x7ff) {
LAB_001b8c63:
        iVar1 = FindLatestMTMessage(local_1838,(int)uVar2,addr,mid,&local_18b0,&local_18b4);
        if (iVar1 != 0) {
          do {
            lVar5 = local_1870;
            lVar4 = lStack_1868;
            if (local_1850 == 0) {
              clock_gettime(4,&local_18a0);
              lVar5 = ((local_18a0.tv_sec + local_1870) - local_1890.tv_sec) +
                      (local_18a0.tv_nsec + lStack_1868) / 1000000000;
              lVar4 = (local_18a0.tv_nsec + lStack_1868) % 1000000000 - local_1890.tv_nsec;
              if (lVar4 < 0) {
                lVar5 = lVar5 + ~((ulong)-lVar4 / 1000000000);
                lVar4 = lVar4 + 1000000000 + ((ulong)-lVar4 / 1000000000) * 1000000000;
              }
            }
            if (4.0 < (double)lVar4 / 1000000000.0 + (double)lVar5) {
LAB_001b8e17:
              puts("Error reading data from a MT : Message timeout. ");
              return 2;
            }
            uVar6 = (uint)uVar2;
            if (0xffe < uVar6) {
              puts("Error reading data from a MT : Invalid data. ");
              return 4;
            }
            iVar1 = (pMT->RS232Port).DevType;
            if (iVar1 - 1U < 4) {
              sVar3 = recv((pMT->RS232Port).s,local_1838 + (uVar2 & 0xffffffff),
                           (ulong)(0xfff - uVar6),0);
              iVar1 = (int)sVar3;
            }
            else {
              if (iVar1 != 0) goto LAB_001b8bfa;
              sVar3 = read(*(int *)&(pMT->RS232Port).hDev,local_1838 + (uVar2 & 0xffffffff),
                           (ulong)(0xfff - uVar6));
              iVar1 = (int)sVar3;
            }
            if (iVar1 < 1) goto LAB_001b8bfa;
            uVar2 = (ulong)(uVar6 + iVar1);
            iVar1 = FindLatestMTMessage(local_1838,uVar6 + iVar1,addr,mid,&local_18b0,&local_18b4);
          } while (iVar1 != 0);
        }
        __dest = local_1840;
        iVar1 = local_18a4;
        memset(local_1840,0,(long)local_18a4);
        uVar6 = (uint)local_18b0[3];
        if (local_18b0[3] == 0xff) {
          uVar6 = (uint)(ushort)(*(ushort *)(local_18b0 + 4) << 8 | *(ushort *)(local_18b0 + 4) >> 8
                                );
          lVar4 = 6;
        }
        else {
          lVar4 = 4;
        }
        local_18b0 = local_18b0 + lVar4;
        *pNbdatabytes = uVar6;
        if ((int)uVar6 <= iVar1) {
          if (uVar6 == 0) {
            return 0;
          }
          memcpy(__dest,local_18b0,(ulong)uVar6);
          return 0;
        }
        __s = "Too small data buffer.";
        goto LAB_001b8c01;
      }
      local_1848 = (uint *)pNbdatabytes;
      do {
        if ((int)uVar2 != 0x7ff) {
          __n = uVar2 & 0xffffffff;
          memmove(auStack_1039 + -__n,local_1838,__n);
          memcpy(local_1838,local_838 + __n,(long)(0x7ff - (int)uVar2));
          uVar2 = 0x7ff;
          pNbdatabytes = (int *)local_1848;
          goto LAB_001b8c63;
        }
        lVar5 = local_1870;
        lVar4 = lStack_1868;
        if (local_1850 == 0) {
          clock_gettime(4,&local_18a0);
          lVar5 = ((local_18a0.tv_sec + local_1870) - local_1890.tv_sec) +
                  (local_18a0.tv_nsec + lStack_1868) / 1000000000;
          lVar4 = (local_18a0.tv_nsec + lStack_1868) % 1000000000 - local_1890.tv_nsec;
          if (lVar4 < 0) {
            lVar5 = lVar5 + ~((ulong)-lVar4 / 1000000000);
            lVar4 = lVar4 + 1000000000 + ((ulong)-lVar4 / 1000000000) * 1000000000;
          }
        }
        if (4.0 < (double)lVar4 / 1000000000.0 + (double)lVar5) goto LAB_001b8e17;
        memcpy(local_838,local_1838,0x7ff);
        iVar1 = (pMT->RS232Port).DevType;
        if (iVar1 - 1U < 4) {
          bVar7 = false;
          uVar2 = recv((pMT->RS232Port).s,local_1838,0x7ff,0);
          if ((int)uVar2 < 1) break;
        }
        else {
          if (iVar1 != 0) break;
          uVar2 = read(*(int *)&(pMT->RS232Port).hDev,local_1838,0x7ff);
          bVar7 = (int)uVar2 == 0;
          if ((int)uVar2 < 0) break;
        }
      } while (!bVar7);
    }
  }
  else if (iVar1 == 0) {
    uVar2 = read(*(int *)&(pMT->RS232Port).hDev,local_1838,0x7ff);
    goto LAB_001b8a73;
  }
LAB_001b8bfa:
  __s = "Error reading data from a MT. ";
LAB_001b8c01:
  puts(__s);
  return 1;
}

Assistant:

inline int GetLatestMTMessageMT(MT* pMT, int addr, int mid, unsigned char* databuf, int databuflen, int* pNbdatabytes)
{
	unsigned char recvbuf[2*MAX_NB_BYTES_MT];
	unsigned char savebuf[MAX_NB_BYTES_MT];
	int BytesReceived = 0, Bytes = 0, recvbuflen = 0;
	unsigned char* ptr = NULL;
	int len = 0;
	CHRONO chrono;

	StartChrono(&chrono);

	// Prepare the buffers.
	memset(recvbuf, 0, sizeof(recvbuf));
	memset(savebuf, 0, sizeof(savebuf));
	recvbuflen = MAX_NB_BYTES_MT-1; // The last character must be a 0 to be a valid string for sscanf.
	BytesReceived = 0;

	if (ReadRS232Port(&pMT->RS232Port, (unsigned char*)recvbuf, recvbuflen, &Bytes) != EXIT_SUCCESS)
	{
		printf("Error reading data from a MT. \n");
		return EXIT_FAILURE;
	}
	BytesReceived += Bytes;

	if (BytesReceived >= recvbuflen)
	{
		// If the buffer is full and if the device always sends data, there might be old data to discard...

		while (Bytes == recvbuflen)
		{
			if (GetTimeElapsedChronoQuick(&chrono) > TIMEOUT_MESSAGE_MT)
			{
				printf("Error reading data from a MT : Message timeout. \n");
				return EXIT_TIMEOUT;
			}
			memcpy(savebuf, recvbuf, Bytes);
			if (ReadRS232Port(&pMT->RS232Port, (unsigned char*)recvbuf, recvbuflen, &Bytes) != EXIT_SUCCESS)
			{
				printf("Error reading data from a MT. \n");
				return EXIT_FAILURE;
			}
			BytesReceived += Bytes;
		}

		// The desired message should be among all the data gathered, unless there was 
		// so many other messages sent after that the desired message was in the 
		// discarded data, or we did not wait enough...

		memmove(recvbuf+recvbuflen-Bytes, recvbuf, Bytes);
		memcpy(recvbuf, savebuf+Bytes, recvbuflen-Bytes);

		// Only the last recvbuflen bytes received should be taken into account in what follows.
		BytesReceived = recvbuflen;
	}

	// The data need to be analyzed and we must check if we need to get more data from 
	// the device to get the desired message.
	// But normally we should not have to get more data unless we did not wait enough
	// for the desired message...

	while (FindLatestMTMessage(recvbuf, BytesReceived, addr, mid, &ptr, &len) != EXIT_SUCCESS)
	{
		if (GetTimeElapsedChronoQuick(&chrono) > TIMEOUT_MESSAGE_MT)
		{
			printf("Error reading data from a MT : Message timeout. \n");
			return EXIT_TIMEOUT;
		}
		// The last character must be a 0 to be a valid string for sscanf.
		if (BytesReceived >= 2*MAX_NB_BYTES_MT-1)
		{
			printf("Error reading data from a MT : Invalid data. \n");
			return EXIT_INVALID_DATA;
		}
		if (ReadRS232Port(&pMT->RS232Port, (unsigned char*)recvbuf+BytesReceived, 2*MAX_NB_BYTES_MT-1-BytesReceived, &Bytes) != EXIT_SUCCESS)
		{
			printf("Error reading data from a MT. \n");
			return EXIT_FAILURE;
		}
		BytesReceived += Bytes;
	}

	// Get data bytes.

	memset(databuf, 0, databuflen);
	ptr = GetDataBytesMTMessage(ptr, pNbdatabytes);
	// Check the number of data bytes before copy.
	if (databuflen < *pNbdatabytes)
	{
		printf("Too small data buffer.\n");
		return EXIT_FAILURE;
	}
	// Copy the data bytes of the message.
	if (*pNbdatabytes > 0)
	{
		memcpy(databuf, ptr, *pNbdatabytes);
	}

	return EXIT_SUCCESS;
}